

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

Builder * embree::sse2::BVH4Triangle4iMeshBuilderMortonGeneral
                    (void *bvh,TriangleMesh *mesh,uint geomID,size_t mode)

{
  Builder *pBVar1;
  _func_int **pp_Var2;
  
  pBVar1 = (Builder *)operator_new(0x78);
  (pBVar1->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar1->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__BVHNMeshBuilderMorton_0218c200;
  pBVar1[1].super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pBVar1[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)mesh;
  pp_Var2 = (_func_int **)(*(long *)((long)bvh + 0x60) + 0x550);
  if (*(long *)((long)bvh + 0x60) == 0) {
    pp_Var2 = (_func_int **)0x0;
  }
  pBVar1[2].super_RefCount._vptr_RefCount = pp_Var2;
  *(undefined1 *)&pBVar1[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar1[4].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar1[3].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar1[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar1[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 4;
  pBVar1[5].super_RefCount._vptr_RefCount = (_func_int **)0x20;
  pBVar1[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 4;
  pBVar1[6].super_RefCount._vptr_RefCount = (_func_int **)0x4;
  pBVar1[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0x400;
  *(uint *)&pBVar1[7].super_RefCount._vptr_RefCount = geomID;
  *(undefined4 *)((long)&pBVar1[7].super_RefCount._vptr_RefCount + 4) = 0;
  return pBVar1;
}

Assistant:

Builder* BVH4Triangle4iMeshBuilderMortonGeneral (void* bvh, TriangleMesh* mesh, unsigned int geomID, size_t mode) { return new class BVHNMeshBuilderMorton<4,TriangleMesh,Triangle4i>((BVH4*)bvh,mesh,geomID,4,4); }